

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_buffered_region.h
# Opt level: O0

void __thiscall
S2ShapeIndexBufferedRegion::S2ShapeIndexBufferedRegion
          (S2ShapeIndexBufferedRegion *this,S2ShapeIndex *index,S1ChordAngle radius)

{
  S1ChordAngle SVar1;
  S2ShapeIndex *index_00;
  Options *this_00;
  Options local_48;
  S2ShapeIndex *local_20;
  S2ShapeIndex *index_local;
  S2ShapeIndexBufferedRegion *this_local;
  S1ChordAngle radius_local;
  
  local_20 = index;
  index_local = (S2ShapeIndex *)this;
  this_local = (S2ShapeIndexBufferedRegion *)radius.length2_;
  S2Region::S2Region(&this->super_S2Region);
  (this->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2ShapeIndexBufferedRegion_0062efa8;
  (this->radius_).length2_ = (double)this_local;
  SVar1 = S1ChordAngle::Successor((S1ChordAngle *)&this_local);
  index_00 = local_20;
  (this->radius_successor_).length2_ = SVar1.length2_;
  local_48.super_Options.max_distance_.super_S1ChordAngle.length2_ = (S1ChordAngle)0.0;
  local_48.super_Options.max_error_.length2_ = 0.0;
  local_48.super_Options.max_results_ = 0;
  local_48.super_Options.include_interiors_ = false;
  local_48.super_Options.use_brute_force_ = false;
  local_48.super_Options._22_2_ = 0;
  S2ClosestEdgeQuery::Options::Options(&local_48);
  S2ClosestEdgeQuery::S2ClosestEdgeQuery(&this->query_,index_00,&local_48);
  this_00 = &S2ClosestEdgeQuery::mutable_options(&this->query_)->super_Options;
  S2ClosestEdgeQueryBase<S2MinDistance>::Options::set_include_interiors(this_00,true);
  return;
}

Assistant:

inline S2ShapeIndexBufferedRegion::S2ShapeIndexBufferedRegion(
    const S2ShapeIndex* index, S1ChordAngle radius)
    : radius_(radius), radius_successor_(radius.Successor()), query_(index) {
  query_.mutable_options()->set_include_interiors(true);
}